

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pBVar4;
  int *piVar5;
  Allocator *pAVar6;
  pointer pMVar7;
  long *plVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Layer *pLVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  void *__ptr;
  Mat *pMVar15;
  long lVar16;
  char *pcVar17;
  int *piVar18;
  int j;
  int iVar19;
  size_t sVar20;
  size_t sStack_150;
  int top_count;
  int bottom_count;
  int typeindex;
  Layer *local_130;
  ulong local_128;
  int blob_count;
  Mat *local_118;
  ulong local_110;
  long local_108;
  int layer_count;
  Net *local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  int magic;
  vector<int,_std::allocator<int>_> *local_e0;
  ParamDict pd;
  int bottom_blob_index;
  undefined4 uStack_bc;
  int *local_b8;
  Allocator *local_a0;
  int local_88;
  size_t local_80;
  Mat local_78;
  
  magic = 0;
  iVar9 = (*dr->_vptr_DataReader[3])(dr,&magic,4);
  if (CONCAT44(extraout_var,iVar9) == 4) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar9 = (*dr->_vptr_DataReader[3])(dr,&layer_count,4);
      if (CONCAT44(extraout_var_00,iVar9) == 4) {
        iVar9 = (*dr->_vptr_DataReader[3])(dr,&blob_count,4);
        if (CONCAT44(extraout_var_01,iVar9) == 4) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)layer_count);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar12 = 0;
            local_f8 = this;
            do {
              if ((long)layer_count <= (long)uVar12) {
                iVar9 = 0;
                NetPrivate::update_input_output_indexes(this->d);
LAB_0016b26b:
                ParamDict::~ParamDict(&pd);
                return iVar9;
              }
              local_128 = uVar12;
              iVar9 = (*dr->_vptr_DataReader[3])(dr,&typeindex,4);
              if (CONCAT44(extraout_var_02,iVar9) != 4) {
                pcVar17 = "read typeindex failed";
LAB_0016b355:
                sStack_150 = 0x15;
LAB_0016b254:
                fwrite(pcVar17,sStack_150,1,_stderr);
                fputc(10,_stderr);
LAB_0016b268:
                iVar9 = -1;
                goto LAB_0016b26b;
              }
              iVar9 = (*dr->_vptr_DataReader[3])(dr,&bottom_count,4);
              if (CONCAT44(extraout_var_03,iVar9) != 4) {
                pcVar17 = "read bottom_count failed";
                sStack_150 = 0x18;
                goto LAB_0016b254;
              }
              iVar9 = (*dr->_vptr_DataReader[3])(dr,&top_count,4);
              if (CONCAT44(extraout_var_04,iVar9) != 4) {
                pcVar17 = "read top_count failed";
                goto LAB_0016b355;
              }
              iVar9 = (*this->_vptr_Net[6])(this,(ulong)(uint)typeindex);
              pLVar10 = (Layer *)CONCAT44(extraout_var_05,iVar9);
              if ((pLVar10 == (Layer *)0x0) &&
                 (pLVar10 = create_layer(typeindex), pLVar10 == (Layer *)0x0)) {
                iVar9 = (*this->_vptr_Net[5])(this,(ulong)(typeindex & 0xfffffeff));
                pLVar10 = (Layer *)CONCAT44(extraout_var_06,iVar9);
                if (pLVar10 != (Layer *)0x0) goto LAB_0016ab34;
                fprintf(_stderr,"layer %d not exists or registered",(ulong)(uint)typeindex);
                fputc(10,_stderr);
                clear(this);
                goto LAB_0016b268;
              }
LAB_0016ab34:
              local_e0 = &pLVar10->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_e0,(long)bottom_count);
              local_130 = pLVar10;
              for (lVar14 = 0; lVar14 < bottom_count; lVar14 = lVar14 + 1) {
                iVar9 = (*dr->_vptr_DataReader[3])(dr,(Mat *)&bottom_blob_index,4);
                if (CONCAT44(extraout_var_07,iVar9) != 4) {
                  pcVar17 = "read bottom_blob_index failed";
                  sStack_150 = 0x1d;
                  goto LAB_0016b254;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[bottom_blob_index].consumer = (int)local_128;
                (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar14] = bottom_blob_index;
              }
              local_f0 = &local_130->tops;
              std::vector<int,_std::allocator<int>_>::resize(local_f0,(long)top_count);
              for (lVar14 = 0; lVar14 < top_count; lVar14 = lVar14 + 1) {
                iVar9 = (*dr->_vptr_DataReader[3])(dr,(Mat *)&bottom_blob_index,4);
                if (CONCAT44(extraout_var_08,iVar9) != 4) {
                  pcVar17 = "read top_blob_index failed";
                  sStack_150 = 0x1a;
                  goto LAB_0016b254;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[bottom_blob_index].producer = (int)local_128;
                (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar14] = bottom_blob_index;
              }
              iVar9 = ParamDict::load_param_bin(&pd,dr);
              uVar12 = local_128;
              if (iVar9 == 0) {
                if (local_130->support_int8_storage == true) {
                  (this->opt).use_vulkan_compute = false;
                }
                local_78.cstep = 0;
                local_78.data = (void *)0x0;
                local_78.refcount._0_4_ = 0;
                local_78.refcount._4_4_ = 0;
                local_78.elemsize._0_4_ = 0;
                local_78._20_8_ = 0;
                local_78.h = 0;
                local_78.d = 0;
                local_78.c = 0;
                local_78.allocator = (Allocator *)0x0;
                local_78.dims = 0;
                local_78.w = 0;
                ParamDict::get((Mat *)&bottom_blob_index,&pd,0x1e,&local_78);
                piVar18 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if (local_78.allocator == (Allocator *)0x0) {
                      free(local_78.data);
                    }
                    else {
                      (*(local_78.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if ((CONCAT44(uStack_bc,bottom_blob_index) != 0) && ((long)local_88 * local_80 != 0)
                   ) {
                  piVar18 = (int *)(CONCAT44(uStack_bc,bottom_blob_index) + 0xc);
                  for (lVar14 = 0; iVar9 = 1, lVar14 < top_count; lVar14 = lVar14 + 1) {
                    iVar3 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar14];
                    pBVar4 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar13 = piVar18[-3];
                    if (iVar13 == 3) {
                      uVar11 = piVar18[-2];
                      uVar12 = (ulong)(int)uVar11;
                      iVar9 = piVar18[-1];
                      lVar16 = (long)iVar9;
                      iVar19 = *piVar18;
                      sVar20 = lVar16 * uVar12 + 3 & 0x3ffffffffffffffc;
                      pMVar15 = &pBVar4[iVar3].shape;
                      piVar5 = pBVar4[iVar3].shape.refcount;
                      if (piVar5 == (int *)0x0) {
LAB_0016ae79:
                        iVar13 = 3;
                      }
                      else {
                        LOCK();
                        *piVar5 = *piVar5 + -1;
                        UNLOCK();
                        if (*piVar5 != 0) goto LAB_0016ae79;
                        __ptr = pBVar4[iVar3].shape.data;
                        pAVar6 = pBVar4[iVar3].shape.allocator;
                        local_110 = uVar12;
                        local_108 = lVar16;
                        if (pAVar6 == (Allocator *)0x0) {
LAB_0016ae91:
                          local_118 = &pBVar4[iVar3].shape;
                          free(__ptr);
                          uVar11 = (uint)local_110;
                          iVar9 = (int)local_108;
                          pMVar15 = local_118;
                        }
                        else {
                          local_118 = pMVar15;
                          (*pAVar6->_vptr_Allocator[3])();
                          iVar13 = 3;
                          uVar11 = (uint)local_110;
                          iVar9 = (int)local_108;
                          pMVar15 = local_118;
                        }
                      }
LAB_0016aeab:
                      pMVar15->data = (void *)0x0;
                      pMVar15->refcount = (int *)0x0;
                      pBVar4[iVar3].shape.elemsize = 4;
                      pBVar4[iVar3].shape.elempack = 1;
                      pBVar4[iVar3].shape.allocator = (Allocator *)0x0;
                      pBVar4[iVar3].shape.dims = iVar13;
                      pBVar4[iVar3].shape.w = uVar11;
                      pBVar4[iVar3].shape.h = iVar9;
                      pBVar4[iVar3].shape.d = 1;
                      pBVar4[iVar3].shape.c = iVar19;
                      pBVar4[iVar3].shape.cstep = sVar20;
                      this = local_f8;
                    }
                    else {
                      if (iVar13 == 2) {
                        uVar11 = piVar18[-2];
                        uVar12 = (ulong)(int)uVar11;
                        iVar9 = piVar18[-1];
                        lVar16 = (long)iVar9;
                        sVar20 = lVar16 * uVar12;
                        piVar5 = pBVar4[iVar3].shape.refcount;
                        if (piVar5 != (int *)0x0) {
                          LOCK();
                          *piVar5 = *piVar5 + -1;
                          UNLOCK();
                          if (*piVar5 == 0) {
                            __ptr = pBVar4[iVar3].shape.data;
                            pAVar6 = pBVar4[iVar3].shape.allocator;
                            local_110 = uVar12;
                            local_108 = lVar16;
                            if (pAVar6 == (Allocator *)0x0) {
LAB_0016ae8e:
                              iVar19 = 1;
                              goto LAB_0016ae91;
                            }
                            local_118 = &pBVar4[iVar3].shape;
                            (*pAVar6->_vptr_Allocator[3])();
                            iVar13 = 2;
                            iVar19 = 1;
                            uVar11 = (uint)local_110;
                            iVar9 = (int)local_108;
                            pMVar15 = local_118;
                            goto LAB_0016aeab;
                          }
                        }
                        iVar19 = 2;
LAB_0016ae82:
                        iVar13 = iVar19;
                        iVar19 = 1;
                        pMVar15 = &pBVar4[iVar3].shape;
                        goto LAB_0016aeab;
                      }
                      if (iVar13 == 1) {
                        uVar11 = piVar18[-2];
                        sVar20 = (size_t)(int)uVar11;
                        piVar5 = pBVar4[iVar3].shape.refcount;
                        iVar19 = iVar9;
                        if (piVar5 != (int *)0x0) {
                          LOCK();
                          *piVar5 = *piVar5 + -1;
                          UNLOCK();
                          if (*piVar5 == 0) {
                            __ptr = pBVar4[iVar3].shape.data;
                            pAVar6 = pBVar4[iVar3].shape.allocator;
                            local_110 = (ulong)uVar11;
                            if (pAVar6 == (Allocator *)0x0) {
                              local_108 = 1;
                              goto LAB_0016ae8e;
                            }
                            local_118 = &pBVar4[iVar3].shape;
                            (*pAVar6->_vptr_Allocator[3])();
                            iVar9 = 1;
                            iVar19 = 1;
                            uVar11 = (uint)local_110;
                            pMVar15 = local_118;
                            iVar13 = iVar9;
                            goto LAB_0016aeab;
                          }
                        }
                        goto LAB_0016ae82;
                      }
                    }
                    piVar18 = piVar18 + 4;
                  }
                }
                pvVar1 = &local_130->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar1,(long)bottom_count);
                lVar14 = 0;
                for (lVar16 = 0; lVar16 < bottom_count; lVar16 = lVar16 + 1) {
                  iVar9 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar16];
                  pBVar4 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar7 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                  if ((Mat *)puVar2 != &pBVar4[iVar9].shape) {
                    piVar18 = pBVar4[iVar9].shape.refcount;
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + 1;
                      UNLOCK();
                    }
                    piVar18 = *(int **)((long)&pMVar7->refcount + lVar14);
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + -1;
                      UNLOCK();
                      if (*piVar18 == 0) {
                        plVar8 = *(long **)((long)&pMVar7->allocator + lVar14);
                        if (plVar8 == (long *)0x0) {
                          free(*(void **)((long)&pMVar7->data + lVar14));
                        }
                        else {
                          (**(code **)(*plVar8 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar7->cstep + lVar14) = 0;
                    *(undefined8 *)((long)puVar2 + 0xc) = 0;
                    *(undefined8 *)((long)puVar2 + 0x14) = 0;
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    *(undefined4 *)((long)&pMVar7->c + lVar14) = 0;
                    puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar14);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    piVar18 = pBVar4[iVar9].shape.refcount;
                    puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                    *puVar2 = pBVar4[iVar9].shape.data;
                    puVar2[1] = piVar18;
                    *(size_t *)((long)&pMVar7->elemsize + lVar14) = pBVar4[iVar9].shape.elemsize;
                    *(int *)((long)&pMVar7->elempack + lVar14) = pBVar4[iVar9].shape.elempack;
                    *(Allocator **)((long)&pMVar7->allocator + lVar14) =
                         pBVar4[iVar9].shape.allocator;
                    iVar3 = pBVar4[iVar9].shape.w;
                    iVar13 = pBVar4[iVar9].shape.h;
                    iVar19 = pBVar4[iVar9].shape.d;
                    piVar18 = (int *)((long)&pMVar7->dims + lVar14);
                    *piVar18 = pBVar4[iVar9].shape.dims;
                    piVar18[1] = iVar3;
                    piVar18[2] = iVar13;
                    piVar18[3] = iVar19;
                    *(int *)((long)&pMVar7->c + lVar14) = pBVar4[iVar9].shape.c;
                    *(size_t *)((long)&pMVar7->cstep + lVar14) = pBVar4[iVar9].shape.cstep;
                  }
                  lVar14 = lVar14 + 0x48;
                  this = local_f8;
                }
                pvVar1 = &local_130->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)top_count);
                lVar14 = 0;
                for (lVar16 = 0; lVar16 < top_count; lVar16 = lVar16 + 1) {
                  iVar9 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar16];
                  pBVar4 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar7 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                  if ((Mat *)puVar2 != &pBVar4[iVar9].shape) {
                    piVar18 = pBVar4[iVar9].shape.refcount;
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + 1;
                      UNLOCK();
                    }
                    piVar18 = *(int **)((long)&pMVar7->refcount + lVar14);
                    if (piVar18 != (int *)0x0) {
                      LOCK();
                      *piVar18 = *piVar18 + -1;
                      UNLOCK();
                      if (*piVar18 == 0) {
                        plVar8 = *(long **)((long)&pMVar7->allocator + lVar14);
                        if (plVar8 == (long *)0x0) {
                          free(*(void **)((long)&pMVar7->data + lVar14));
                        }
                        else {
                          (**(code **)(*plVar8 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar7->cstep + lVar14) = 0;
                    *(undefined8 *)((long)puVar2 + 0xc) = 0;
                    *(undefined8 *)((long)puVar2 + 0x14) = 0;
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    *(undefined4 *)((long)&pMVar7->c + lVar14) = 0;
                    puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar14);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    piVar18 = pBVar4[iVar9].shape.refcount;
                    puVar2 = (undefined8 *)((long)&pMVar7->data + lVar14);
                    *puVar2 = pBVar4[iVar9].shape.data;
                    puVar2[1] = piVar18;
                    *(size_t *)((long)&pMVar7->elemsize + lVar14) = pBVar4[iVar9].shape.elemsize;
                    *(int *)((long)&pMVar7->elempack + lVar14) = pBVar4[iVar9].shape.elempack;
                    *(Allocator **)((long)&pMVar7->allocator + lVar14) =
                         pBVar4[iVar9].shape.allocator;
                    iVar3 = pBVar4[iVar9].shape.w;
                    iVar13 = pBVar4[iVar9].shape.h;
                    iVar19 = pBVar4[iVar9].shape.d;
                    piVar18 = (int *)((long)&pMVar7->dims + lVar14);
                    *piVar18 = pBVar4[iVar9].shape.dims;
                    piVar18[1] = iVar3;
                    piVar18[2] = iVar13;
                    piVar18[3] = iVar19;
                    *(int *)((long)&pMVar7->c + lVar14) = pBVar4[iVar9].shape.c;
                    *(size_t *)((long)&pMVar7->cstep + lVar14) = pBVar4[iVar9].shape.cstep;
                  }
                  lVar14 = lVar14 + 0x48;
                  this = local_f8;
                }
                iVar9 = ParamDict::get(&pd,0x1f,0);
                local_130->featmask = iVar9;
                iVar9 = (*local_130->_vptr_Layer[2])(local_130,&pd);
                if (iVar9 == 0) {
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_128] = local_130;
                  iVar9 = 0;
                }
                else {
                  fprintf(_stderr,"layer load_param %d %s failed",local_128,
                          (local_130->name)._M_dataplus._M_p);
                  fputc(10,_stderr);
                  iVar9 = 0xe;
                }
                if (local_b8 != (int *)0x0) {
                  LOCK();
                  *local_b8 = *local_b8 + -1;
                  UNLOCK();
                  if (*local_b8 == 0) {
                    if (local_a0 == (Allocator *)0x0) {
                      free((void *)CONCAT44(uStack_bc,bottom_blob_index));
                    }
                    else {
                      (*local_a0->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar12 = local_128;
                if ((iVar9 != 0xe) && (iVar9 != 0)) goto LAB_0016b268;
              }
              else {
                fprintf(_stderr,"ParamDict load_param %d %s failed",local_128 & 0xffffffff,
                        (local_130->name)._M_dataplus._M_p);
                fputc(10,_stderr);
              }
              uVar12 = uVar12 + 1;
            } while( true );
          }
          pcVar17 = "invalid layer_count or blob_count";
          sStack_150 = 0x21;
        }
        else {
          pcVar17 = "read blob_count failed";
          sStack_150 = 0x16;
        }
      }
      else {
        pcVar17 = "read layer_count failed";
        sStack_150 = 0x17;
      }
    }
    else {
      pcVar17 = "param is too old, please regenerate";
      sStack_150 = 0x23;
    }
  }
  else {
    pcVar17 = "read magic failed";
    sStack_150 = 0x11;
  }
  fwrite(pcVar17,sStack_150,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
        if (!layer)
        {
            layer = create_layer(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}